

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_signed_distance(REF_GRID ref_grid,REF_DBL *field,REF_DBL *distance)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  double dVar2;
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  void *__ptr;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  REF_STATUS unaff_EBP;
  REF_INT RVar10;
  char *pcVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  REF_DBL gradient [3];
  REF_INT nodes [27];
  double local_c8;
  double local_c0;
  double local_b8;
  int local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  if ((long)ref_node->max < 0) {
    unaff_EBP = 1;
    pcVar11 = "malloc set of REF_INT negative";
  }
  else {
    __ptr = malloc((long)ref_node->max << 2);
    if (__ptr != (void *)0x0) {
      bVar3 = true;
      if (0 < ref_node->max) {
        lVar7 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar7 * 4) = 0;
          lVar7 = lVar7 + 1;
        } while (lVar7 < ref_node->max);
      }
      goto LAB_001bc95f;
    }
    unaff_EBP = 2;
    pcVar11 = "malloc set of REF_INT NULL";
  }
  __ptr = (void *)0x0;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x589,
         "ref_phys_signed_distance",pcVar11);
  bVar3 = false;
LAB_001bc95f:
  if (bVar3) {
    if (0 < ref_cell->max) {
      RVar10 = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,RVar10,local_a8);
        if (RVar4 == 0) {
          dVar13 = field[local_a8[0]];
          dVar15 = field[local_a8[1]];
          dVar14 = dVar13;
          if (dVar15 <= dVar13) {
            dVar14 = dVar15;
          }
          dVar17 = field[local_a8[2]];
          if (dVar17 <= dVar14) {
            dVar14 = dVar17;
          }
          if (dVar14 <= 0.0) {
            if (dVar13 <= dVar15) {
              dVar13 = dVar15;
            }
            if (dVar13 <= dVar17) {
              dVar13 = dVar17;
            }
            if (0.0 <= dVar13) {
              uVar5 = ref_node_tri_grad_nodes(ref_node,local_a8,field,&local_c8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x58f,"ref_phys_signed_distance",(ulong)uVar5,"grad");
                return uVar5;
              }
              if (0 < ref_cell->node_per) {
                lVar7 = 0;
                do {
                  dVar13 = local_b8 * local_b8 + local_c8 * local_c8 + local_c0 * local_c0;
                  if (dVar13 < 0.0) {
                    dVar13 = sqrt(dVar13);
                  }
                  else {
                    dVar13 = SQRT(dVar13);
                  }
                  dVar15 = dVar13 * 1e+20;
                  if (dVar15 <= -dVar15) {
                    dVar15 = -dVar15;
                  }
                  lVar8 = (long)local_a8[lVar7];
                  dVar14 = field[lVar8];
                  dVar17 = dVar14;
                  if (dVar14 <= -dVar14) {
                    dVar17 = -dVar14;
                  }
                  distance[lVar8] = (REF_DBL)(-(ulong)(dVar17 < dVar15) & (ulong)(dVar14 / dVar13));
                  *(undefined4 *)((long)__ptr + lVar8 * 4) = 1;
                  lVar7 = lVar7 + 1;
                } while (lVar7 < ref_cell->node_per);
              }
            }
          }
        }
        RVar10 = RVar10 + 1;
      } while (RVar10 < ref_cell->max);
    }
    do {
      if (ref_cell->max < 1) break;
      bVar3 = false;
      RVar10 = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,RVar10,local_a8);
        if (((RVar4 == 0) &&
            (*(int *)((long)__ptr + (long)local_a8[1] * 4) +
             *(int *)((long)__ptr + (long)local_a8[0] * 4) +
             *(int *)((long)__ptr + (long)local_a8[2] * 4) == 2)) && (0 < ref_cell->node_per)) {
          uVar12 = 0;
          do {
            lVar7 = (long)local_a8[uVar12];
            if (*(int *)((long)__ptr + lVar7 * 4) == 0) {
              iVar6 = (uint)(uVar12 < 2) * 3 + (int)uVar12 + -2;
              pRVar1 = ref_node->real;
              lVar8 = (long)local_a8[iVar6];
              dVar13 = (pRVar1[lVar8 * 0xf + 2] - pRVar1[lVar7 * 0xf + 2]) *
                       (pRVar1[lVar8 * 0xf + 2] - pRVar1[lVar7 * 0xf + 2]) +
                       (pRVar1[lVar8 * 0xf + 1] - pRVar1[lVar7 * 0xf + 1]) *
                       (pRVar1[lVar8 * 0xf + 1] - pRVar1[lVar7 * 0xf + 1]) +
                       (pRVar1[lVar8 * 0xf] - pRVar1[lVar7 * 0xf]) *
                       (pRVar1[lVar8 * 0xf] - pRVar1[lVar7 * 0xf]);
              if (dVar13 < 0.0) {
                dVar13 = sqrt(dVar13);
              }
              else {
                dVar13 = SQRT(dVar13);
              }
              dVar15 = distance[local_a8[iVar6]];
              pRVar1 = ref_node->real;
              lVar7 = 2;
              if (uVar12 != 0) {
                lVar7 = uVar12 - 1;
              }
              lVar8 = (long)local_a8[lVar7];
              lVar9 = (long)local_a8[uVar12];
              dVar14 = (pRVar1[lVar8 * 0xf + 2] - pRVar1[lVar9 * 0xf + 2]) *
                       (pRVar1[lVar8 * 0xf + 2] - pRVar1[lVar9 * 0xf + 2]) +
                       (pRVar1[lVar8 * 0xf + 1] - pRVar1[lVar9 * 0xf + 1]) *
                       (pRVar1[lVar8 * 0xf + 1] - pRVar1[lVar9 * 0xf + 1]) +
                       (pRVar1[lVar8 * 0xf] - pRVar1[lVar9 * 0xf]) *
                       (pRVar1[lVar8 * 0xf] - pRVar1[lVar9 * 0xf]);
              if (dVar14 < 0.0) {
                dVar14 = sqrt(dVar14);
              }
              else {
                dVar14 = SQRT(dVar14);
              }
              if (dVar15 <= -dVar15) {
                dVar15 = -dVar15;
              }
              dVar17 = distance[local_a8[lVar7]];
              dVar16 = -dVar17;
              dVar18 = dVar17;
              if (dVar17 <= dVar16) {
                dVar18 = dVar16;
              }
              dVar2 = dVar13 + dVar15;
              if (dVar18 + dVar14 <= dVar13 + dVar15) {
                dVar2 = dVar18 + dVar14;
              }
              iVar6 = local_a8[uVar12];
              distance[iVar6] =
                   (REF_DBL)(-(ulong)(dVar17 < dVar16) & (ulong)-dVar2 |
                            ~-(ulong)(dVar17 < dVar16) & (ulong)dVar2);
              *(undefined4 *)((long)__ptr + (long)iVar6 * 4) = 1;
              bVar3 = true;
            }
            uVar12 = uVar12 + 1;
          } while ((long)uVar12 < (long)ref_cell->node_per);
        }
        RVar10 = RVar10 + 1;
      } while (RVar10 < ref_cell->max);
    } while (bVar3);
    unaff_EBP = 0;
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return unaff_EBP;
}

Assistant:

REF_FCN REF_STATUS ref_phys_signed_distance(REF_GRID ref_grid, REF_DBL *field,
                                            REF_DBL *distance) {
  REF_DBL node_min, node_max;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL gradient[3], slope, dist, len;
  REF_INT cell_node, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *set;
  REF_BOOL update;
  REF_INT passes;
  ref_malloc_init(set, ref_node_max(ref_node), REF_INT, 0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    node_min = MIN(MIN(field[nodes[0]], field[nodes[1]]), field[nodes[2]]);
    node_max = MAX(MAX(field[nodes[0]], field[nodes[1]]), field[nodes[2]]);
    if (node_min <= 0.0 && 0.0 <= node_max) {
      RSS(ref_node_tri_grad_nodes(ref_node, nodes, field, gradient), "grad");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        slope = sqrt(gradient[0] * gradient[0] + gradient[1] * gradient[1] +
                     gradient[2] * gradient[2]);
        if (ref_math_divisible(field[nodes[cell_node]], slope)) {
          distance[nodes[cell_node]] = field[nodes[cell_node]] / slope;
        } else {
          distance[nodes[cell_node]] = 0.0;
        }
        set[nodes[cell_node]] = 1;
      }
    }
  }

  update = REF_TRUE;
  passes = 0;
  while (update) {
    update = REF_FALSE;
    passes++;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (2 == set[nodes[0]] + set[nodes[1]] + set[nodes[2]]) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          if (0 == set[nodes[cell_node]]) {
            dist = 0;
            node = cell_node + 1;
            if (2 < node) node -= 3;
            len = sqrt(pow(ref_node_xyz(ref_node, 0, nodes[node]) -
                               ref_node_xyz(ref_node, 0, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 1, nodes[node]) -
                               ref_node_xyz(ref_node, 1, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 2, nodes[node]) -
                               ref_node_xyz(ref_node, 2, nodes[cell_node]),
                           2));
            dist = ABS(distance[nodes[node]]) + len;
            node = cell_node + 2;
            if (2 < node) node -= 3;
            len = sqrt(pow(ref_node_xyz(ref_node, 0, nodes[node]) -
                               ref_node_xyz(ref_node, 0, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 1, nodes[node]) -
                               ref_node_xyz(ref_node, 1, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 2, nodes[node]) -
                               ref_node_xyz(ref_node, 2, nodes[cell_node]),
                           2));

            dist = MIN(dist, ABS(distance[nodes[node]]) + len);
            if (distance[nodes[node]] >= 0.0) {
              distance[nodes[cell_node]] = dist;
            } else {
              distance[nodes[cell_node]] = -dist;
            }
            set[nodes[cell_node]] = 1;
            update = REF_TRUE;
          }
        }
      }
    }
  }

  ref_free(set);
  return REF_SUCCESS;
}